

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O0

bool __thiscall KeyValueFile::loadFromString(KeyValueFile *this,char *data,char *debug_file_name)

{
  PrintErrorFunc p_Var1;
  int iVar2;
  bool bVar3;
  undefined1 uVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *in_RDX;
  char *in_RSI;
  KeyValueFile *in_RDI;
  bool ok;
  bool concat;
  int j;
  bool commentAfterConcat;
  char c;
  int i;
  int line;
  bool include;
  bool error;
  bool eqFound;
  bool readKey;
  bool comment;
  StringKeyValue x;
  int len;
  undefined5 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8d;
  undefined1 in_stack_fffffffffffffa8f;
  StringKeyValue *in_stack_fffffffffffffa90;
  value_type *in_stack_fffffffffffffa98;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
  *in_stack_fffffffffffffaa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  allocator<char> *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  string local_500 [39];
  undefined1 local_4d9 [33];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [20];
  int in_stack_fffffffffffffbdc;
  char *in_stack_fffffffffffffbe0;
  KeyValueFile *in_stack_fffffffffffffbe8;
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [39];
  undefined1 local_369;
  string local_368 [39];
  undefined1 local_341 [33];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [35];
  bool local_8d;
  int local_80;
  byte local_7a;
  char local_79;
  int local_78;
  int local_74;
  byte local_6d;
  byte local_6c;
  byte local_6b;
  byte local_6a;
  byte local_69;
  string local_68 [32];
  string local_48 [36];
  int local_24;
  char *local_20;
  char *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::operator=((string *)&in_RDI->fileName,in_RDX);
  if (local_18 == (char *)0x0) {
    local_1 = 0;
  }
  else {
    bVar3 = isUtf8Bom(in_RDI,local_18);
    if (bVar3) {
      local_18 = local_18 + 3;
    }
    sVar5 = strlen(local_18);
    local_24 = (int)sVar5;
    StringKeyValue::StringKeyValue(in_stack_fffffffffffffa90);
    local_69 = 0;
    local_6a = 1;
    local_6b = 0;
    local_6c = 0;
    local_6d = 0;
    local_74 = 1;
    for (local_78 = 0; local_78 <= local_24; local_78 = local_78 + 1) {
      local_79 = local_18[local_78];
      if (local_79 == '\\') {
        if (local_78 == local_24 + -1) {
          local_78 = local_78 + 1;
        }
        else {
          local_7a = 0;
          iVar2 = local_78;
          do {
            local_80 = iVar2 + 1;
            if (local_24 <= local_80) goto LAB_0013c2a9;
            if ((local_18[local_80] == ';') &&
               (in_stack_fffffffffffffaf7 = isSpace(in_RDI,local_18[iVar2]),
               (bool)in_stack_fffffffffffffaf7)) {
              local_7a = 1;
            }
            if (((local_7a & 1) == 0) && (' ' < local_18[local_80])) goto LAB_0013c2a9;
            if ((local_18[local_80] == '\r') && (local_18[local_80 + 1] == '\n')) {
              local_74 = local_74 + 1;
              local_78 = local_80 + 2;
              local_8d = true;
            }
            else {
              local_8d = local_18[local_80] == '\n';
              if (local_8d) {
                local_74 = local_74 + 1;
                local_78 = local_80 + 1;
              }
            }
            iVar2 = local_80;
          } while (local_8d == false);
          if (((local_69 & 1) != 0) && (in_RDI->printErrorFunc != (PrintErrorFunc)0x0)) {
            p_Var1 = in_RDI->printErrorFunc;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                       (allocator<char> *)in_stack_fffffffffffffac0);
            std::operator+(&in_stack_fffffffffffffa98->key,&in_stack_fffffffffffffa90->key);
            std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
            std::operator+(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
            std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            (*p_Var1)(pcVar7);
            std::__cxx11::string::~string(local_b0);
            std::__cxx11::string::~string(local_d0);
            std::__cxx11::string::~string(local_158);
            std::__cxx11::string::~string(local_f0);
            std::__cxx11::string::~string(local_110);
            std::__cxx11::string::~string(local_130);
            std::allocator<char>::~allocator(&local_131);
          }
          if (((' ' < local_18[local_78]) && (local_18[local_78] != ';')) &&
             (in_RDI->printErrorFunc != (PrintErrorFunc)0x0)) {
            in_stack_fffffffffffffad0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_RDI->printErrorFunc;
            in_stack_fffffffffffffad8 = &local_1f9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                       (allocator<char> *)in_stack_fffffffffffffac0);
            std::operator+(&in_stack_fffffffffffffa98->key,&in_stack_fffffffffffffa90->key);
            std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
            std::operator+(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
            std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
            uVar8 = std::__cxx11::string::c_str();
            (*(code *)in_stack_fffffffffffffad0)(uVar8);
            std::__cxx11::string::~string(local_178);
            std::__cxx11::string::~string(local_198);
            std::__cxx11::string::~string(local_220);
            std::__cxx11::string::~string(local_1b8);
            std::__cxx11::string::~string(local_1d8);
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator(&local_1f9);
          }
          local_79 = local_18[local_78];
        }
      }
LAB_0013c2a9:
      if (((local_79 == '\r') || (local_79 == '\n')) || (local_79 == '\0')) {
        std::__cxx11::string::string(local_260,local_68);
        trimStr(in_RDI,(string *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
        in_stack_fffffffffffffac8 = &local_240;
        std::__cxx11::string::operator=(local_68,(string *)in_stack_fffffffffffffac8);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffac8);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::string(local_2a0,local_48);
        trimStr(in_RDI,(string *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
        std::__cxx11::string::operator=(local_48,local_280);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::string::~string(local_2a0);
        uVar6 = std::__cxx11::string::empty();
        if ((((uVar6 & 1) == 0) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) &&
           (((local_6b & 1) != 0 && ((local_6d & 1) == 0)))) {
          std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
          push_back(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        }
        else {
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            if ((local_6d & 1) == 0) {
              if ((local_6b & 1) == 0) {
                if (in_RDI->printErrorFunc != (PrintErrorFunc)0x0) {
                  in_stack_fffffffffffffaa0 =
                       (vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
                        *)in_RDI->printErrorFunc;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                             (allocator<char> *)in_stack_fffffffffffffac0);
                  std::operator+(&in_stack_fffffffffffffa98->key,&in_stack_fffffffffffffa90->key);
                  std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
                  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
                  std::operator+(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
                  std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
                  uVar8 = std::__cxx11::string::c_str();
                  (*(code *)in_stack_fffffffffffffaa0)(uVar8);
                  std::__cxx11::string::~string(local_390);
                  std::__cxx11::string::~string(local_3b0);
                  std::__cxx11::string::~string(local_438);
                  std::__cxx11::string::~string(local_3d0);
                  std::__cxx11::string::~string(local_3f0);
                  std::__cxx11::string::~string(local_410);
                  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbef);
                }
                local_6c = 1;
              }
              else {
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) != 0) {
                  if (in_RDI->printErrorFunc != (PrintErrorFunc)0x0) {
                    in_stack_fffffffffffffa90 = (StringKeyValue *)in_RDI->printErrorFunc;
                    in_stack_fffffffffffffa98 = (value_type *)local_4d9;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                               (allocator<char> *)in_stack_fffffffffffffac0);
                    std::operator+(&in_stack_fffffffffffffa98->key,&in_stack_fffffffffffffa90->key);
                    std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90
                                  );
                    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
                    std::operator+(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
                    std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90
                                  );
                    uVar8 = std::__cxx11::string::c_str();
                    (*(code *)in_stack_fffffffffffffa90)(uVar8);
                    std::__cxx11::string::~string(local_458);
                    std::__cxx11::string::~string(local_478);
                    std::__cxx11::string::~string(local_500);
                    std::__cxx11::string::~string(local_498);
                    std::__cxx11::string::~string(local_4b8);
                    std::__cxx11::string::~string((string *)(local_4d9 + 1));
                    std::allocator<char>::~allocator((allocator<char> *)local_4d9);
                  }
                  local_6c = 1;
                }
              }
            }
            else if ((local_20 == (char *)0x0) || (*local_20 == '\0')) {
              if (in_RDI->printErrorFunc != (PrintErrorFunc)0x0) {
                p_Var1 = in_RDI->printErrorFunc;
                in_stack_fffffffffffffac0 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_341;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8,
                           (allocator<char> *)in_stack_fffffffffffffac0);
                std::operator+(&in_stack_fffffffffffffa98->key,&in_stack_fffffffffffffa90->key);
                std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
                std::operator+(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
                std::operator+(&in_stack_fffffffffffffa98->key,(char *)in_stack_fffffffffffffa90);
                pcVar7 = (char *)std::__cxx11::string::c_str();
                (*p_Var1)(pcVar7);
                std::__cxx11::string::~string(local_2c0);
                std::__cxx11::string::~string(local_2e0);
                std::__cxx11::string::~string(local_368);
                std::__cxx11::string::~string(local_300);
                std::__cxx11::string::~string(local_320);
                std::__cxx11::string::~string((string *)(local_341 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_341);
              }
              local_6c = 1;
            }
            else {
              std::__cxx11::string::c_str();
              local_369 = includeFile(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                                      in_stack_fffffffffffffbdc);
              local_6c = (local_6c & 1) != 0 || ((local_369 ^ 0xff) & 1) != 0;
            }
          }
        }
        local_69 = 0;
        local_6a = 1;
        local_6b = 0;
        local_6d = 0;
        std::__cxx11::string::clear();
        std::__cxx11::string::clear();
        if (local_79 == '\n') {
          local_74 = local_74 + 1;
        }
      }
      if ((local_79 == ';') &&
         (((local_78 == 0 ||
           (in_stack_fffffffffffffa8f = isSpace(in_RDI,local_18[local_78 + -1]),
           (bool)in_stack_fffffffffffffa8f)) || (local_18[local_78 + -1] == '\n')))) {
        local_69 = 1;
      }
      if ((local_69 & 1) == 0) {
        if ((local_6a & 1) == 0) {
          if ((local_79 == '=') && ((local_6b & 1) == 0)) {
            local_6b = 1;
          }
          else if ((((local_6b & 1) != 0) && ('\x1f' < local_79)) || ((local_6d & 1) != 0)) {
            std::__cxx11::string::operator+=(local_48,local_79);
          }
        }
        else {
          uVar4 = isSpace(in_RDI,local_79);
          if ((((bool)uVar4) || (local_79 < '!')) || (local_79 == '=')) {
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              local_6a = 0;
              if (local_79 == '=') {
                local_6b = 1;
              }
              in_stack_fffffffffffffa8d =
                   std::operator==(&in_stack_fffffffffffffa90->key,
                                   (char *)CONCAT17(in_stack_fffffffffffffa8f,
                                                    CONCAT16(uVar4,CONCAT15(
                                                  in_stack_fffffffffffffa8d,
                                                  in_stack_fffffffffffffa88))));
              if ((bool)in_stack_fffffffffffffa8d) {
                local_6d = 1;
              }
            }
          }
          else {
            std::__cxx11::string::operator+=(local_68,local_79);
          }
        }
      }
    }
    local_1 = (local_6c ^ 0xff) & 1;
    StringKeyValue::~StringKeyValue(in_stack_fffffffffffffa90);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool loadFromString(const char * data, const char * debug_file_name = "")
  {
    fileName = debug_file_name;

    if (!data)
      return false;

    if (isUtf8Bom(data))
      data += 3;
    int len = int(strlen(data));

    StringKeyValue x;
    bool comment = false;
    bool readKey = true;
    bool eqFound = false;
    bool error = false;
    bool include = false;
    int line = 1;

    for (int i = 0; i <= len; i++)
    {
      char c = data[i];

      if (c == '\\')
      {
        if (i == len - 1)
          i++;
        else
        {
          bool commentAfterConcat = false;
          for (int j = i + 1; j < len; j++)
          {
            if (data[j] == ';' && isSpace(data[j - 1]))
              commentAfterConcat = true;

            if (!commentAfterConcat && data[j] > ' ')
              break;

            bool concat = false;
            if (data[j] == 0x0d && data[j + 1] == 0x0a)
            {
              line++;
              i = j + 2;
              concat = true;
            }
            else if (data[j] == 0x0a)
            {
              line++;
              i = j + 1;
              concat = true;
            }

            if (concat)
            {
              if (comment)
                if (printErrorFunc)
                  printErrorFunc((std::string("ERROR: Line concatenation inside comment. At file '") +
                    fileName + "' line " + std::to_string(line - 1) + "\n").c_str());

              if (data[i] > ' ' && data[i] != ';')
                if (printErrorFunc)
                  printErrorFunc((
                    std::string("ERROR: The next line after the line concatenation symbol '\\' must be started with space. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());

              c = data[i];
              break;
            }
          }
        }
      }

      if (c == 0x0d || c == 0x0a || c == 0)
      {
        x.key = trimStr(x.key);
        x.value = trimStr(x.value);
        if (!x.key.empty() && !x.value.empty() && eqFound && !include)
        {
          //printf("%s = \"%s\"\n", x.key.c_str(), x.value.c_str());
          kv.push_back(x);
        }
        else if (!x.key.empty())
        {
          if (include)
          {
            if (!debug_file_name || !debug_file_name[0])
            {
              if (printErrorFunc)
                printErrorFunc(
                  (std::string("ERROR: File name must be passed to loadFromString() when you are using 'include'. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());
              error = true;
            }
            else
            {
              bool ok = includeFile(x.value.c_str(), includeDepth);
              error |= !ok;
            }
          }
          else if (!eqFound)
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
          else if (x.value.empty())
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected value after '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
        }

        comment = false;
        readKey = true;
        eqFound = false;
        include = false;
        x.key.clear();
        x.value.clear();

        if (c == 0x0a)
          line++;
      }

      if (c == ';' && (i == 0 || isSpace(data[i - 1]) || data[i - 1] == 0x0a))
        comment = true;

      if (comment)
        continue;

      if (readKey)
      {
        if (!isSpace(c) && c > ' ' && c != '=')
          x.key += c;
        else if (!x.key.empty())
        {
          readKey = false;
          if (c == '=')
            eqFound = true;

          if (x.key == "include")
            include = true;
        }
      }
      else
      {
        if (c == '=' && !eqFound)
          eqFound = true;
        else if ((eqFound && c >= ' ') || include)
          x.value += c;
      }
    }

    return !error;
  }